

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::findAndNotifyPublicationTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  pointer __src;
  pointer size;
  pointer ppVar1;
  pointer ppVar2;
  pointer pbVar3;
  GlobalHandle GVar4;
  pointer pbVar5;
  ActionMessage link;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Pubtargets;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  local_138;
  UnknownHandleManager *local_118;
  string *local_110;
  undefined1 local_108 [8];
  GlobalHandle GStack_100;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [32];
  string local_b8;
  string *local_98;
  string *local_90;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_118 = &this->unknownHandles;
  local_110 = key;
  UnknownHandleManager::checkForPublications(&local_138,local_118,(string *)key);
  ppVar1 = local_138.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_138.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_138.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GVar4 = (GlobalHandle)
            local_138.
            super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_108 = *(undefined1 (*) [8])GVar4;
      GStack_100.fed_id.gid = -2000000000;
      GStack_100.handle.hid = 0x69;
      local_f8._M_p = (pointer)&local_e8;
      local_f0 = 0;
      local_e8._M_local_buf[0] = '\0';
      local_d8._0_8_ = local_d8 + 0x10;
      local_d8._8_8_ = 0;
      local_d8[0x10] = '\0';
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_98 = (string *)local_d8;
      local_90 = &local_b8;
      local_88[0].
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88[0].
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88[0].
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      connectInterfaces(this,handleInfo,
                        (uint)(ushort)(((GlobalHandle *)((long)GVar4 + 8))->fed_id).gid,
                        (BasicHandleInfo *)local_108,(uint)handleInfo->flags,
                        (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                         )0x4600000032);
      CLI::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &local_e8) {
        operator_delete(local_f8._M_p,
                        CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1)
        ;
      }
      GVar4 = (GlobalHandle)((long)GVar4 + 0xc);
    } while (GVar4 != (GlobalHandle)ppVar1);
  }
  UnknownHandleManager::checkForLinks(&local_48,local_118,(string *)local_110);
  pbVar3 = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar5 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ActionMessage::ActionMessage((ActionMessage *)local_108,cmd_add_named_input);
      __src = (pointer)(pbVar5->_M_dataplus)._M_p;
      size = (pointer)pbVar5->_M_string_length;
      if ((local_88[0].
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != __src) &&
         (SmallBuffer::reserve((SmallBuffer *)(local_d8 + 0x10),(size_t)size), size != (pointer)0x0)
         ) {
        local_88[0].
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = size;
        memcpy(local_88[0].
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,__src,(size_t)size);
        size = local_88[0].
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      }
      local_88[0].
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = size;
      GStack_100 = handleInfo->handle;
      checkForNamedInterface(this,(ActionMessage *)local_108);
      ActionMessage::~ActionMessage((ActionMessage *)local_108);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar3);
  }
  if ((local_138.
       super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_138.
       super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    UnknownHandleManager::clearPublication(local_118,(string *)local_110);
  }
  if ((this->super_BrokerBase).brokerState._M_i == OPERATING) {
    UnknownHandleManager::checkForReconnectionPublications
              ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)local_108,local_118,(string *)local_110);
    ppVar2 = local_138.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar1 = local_138.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_138.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_108;
    local_138.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)GStack_100;
    local_138.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._M_p;
    local_108._0_4_ = 0;
    local_108._4_4_ = 0;
    GStack_100.fed_id.gid = 0;
    GStack_100.handle.hid = 0;
    local_f8._M_p = (pointer)0x0;
    if ((GlobalHandle)ppVar1 != (GlobalHandle)0x0) {
      operator_delete(ppVar1,(long)ppVar2 - (long)ppVar1);
    }
    if ((GlobalHandle)local_108 != (GlobalHandle)0x0) {
      operator_delete((void *)local_108,(long)local_f8._M_p - (long)local_108);
    }
    ppVar1 = local_138.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_138.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      GVar4 = (GlobalHandle)
              local_138.
              super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_108 = *(undefined1 (*) [8])GVar4;
        GStack_100.fed_id.gid = -2000000000;
        GStack_100.handle.hid = 0x69;
        local_f8._M_p = (pointer)&local_e8;
        local_f0 = 0;
        local_e8._M_local_buf[0] = '\0';
        local_d8._0_8_ = local_d8 + 0x10;
        local_d8._8_8_ = 0;
        local_d8[0x10] = '\0';
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_98 = (string *)local_d8;
        local_90 = &local_b8;
        local_88[0].
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88[0].
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88[0].
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        connectInterfaces(this,handleInfo,(uint)*(ushort *)((long)GVar4 + 8),
                          (BasicHandleInfo *)local_108,(uint)handleInfo->flags,
                          (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                           )0x4600000032);
        CLI::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p != &local_e8) {
          operator_delete(local_f8._M_p,
                          CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) +
                          1);
        }
        GVar4 = (GlobalHandle)((long)GVar4 + 0xc);
      } while (GVar4 != (GlobalHandle)ppVar1);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  if ((GlobalHandle)
      local_138.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (GlobalHandle)0x0) {
    operator_delete(local_138.
                    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CoreBroker::findAndNotifyPublicationTargets(BasicHandleInfo& handleInfo,
                                                 const std::string& key)
{
    auto subHandles = unknownHandles.checkForPublications(key);
    for (const auto& sub : subHandles) {
        connectInterfaces(handleInfo,
                          sub.second,
                          BasicHandleInfo(sub.first.fed_id, sub.first.handle, InterfaceType::INPUT),

                          handleInfo.flags,
                          std::make_pair(CMD_ADD_PUBLISHER, CMD_ADD_SUBSCRIBER));
    }

    auto Pubtargets = unknownHandles.checkForLinks(key);
    for (const auto& sub : Pubtargets) {
        ActionMessage link(CMD_ADD_NAMED_INPUT);
        link.name(sub);
        link.setSource(handleInfo.handle);
        checkForNamedInterface(link);
    }
    if (!(subHandles.empty() && Pubtargets.empty())) {
        unknownHandles.clearPublication(key);
    }
    if (getBrokerState() == BrokerState::OPERATING) {
        subHandles = unknownHandles.checkForReconnectionPublications(key);
        for (const auto& sub : subHandles) {
            connectInterfaces(handleInfo,
                              sub.second,
                              BasicHandleInfo(sub.first.fed_id,
                                              sub.first.handle,
                                              InterfaceType::INPUT),

                              handleInfo.flags,
                              std::make_pair(CMD_ADD_PUBLISHER, CMD_ADD_SUBSCRIBER));
        }
    }
}